

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O2

uint encodeAddress(uchar *stream,x86Reg index,int multiplier,x86Reg base,int displacement,
                  uint spareField)

{
  int *piVar1;
  uint uVar2;
  ulong uVar3;
  byte *pbVar4;
  char *__assertion;
  byte bVar5;
  byte bVar6;
  byte *pbVar7;
  byte *pbVar8;
  bool bVar9;
  bool bVar10;
  
  if (index == rESP) {
    __assertion = "index != rESP";
    uVar2 = 0x3b;
  }
  else if (spareField < 0x10) {
    bVar9 = (char)(uchar)displacement != displacement;
    pbVar4 = (byte *)(regCode + base);
    bVar10 = base == rNONE;
    pbVar8 = (byte *)(regCode + 7);
    if (!bVar10) {
      pbVar8 = pbVar4;
    }
    bVar6 = 0x80;
    if (!bVar10 && !bVar9) {
      bVar6 = 0x40;
    }
    bVar5 = (base == rR13 || base == rEBP) << 6;
    if (displacement != 0) {
      bVar5 = bVar6;
    }
    pbVar7 = (byte *)(regCode + 5);
    if (index == rNONE) {
      pbVar7 = pbVar8;
    }
    if (base == rNONE && index == rNONE) {
      bVar5 = 0;
    }
    if (index != rNONE && bVar10) {
      pbVar4 = (byte *)(regCode + 7);
      bVar5 = 0;
    }
    bVar6 = *pbVar4;
    *stream = ((byte)spareField & 7) << 3 | *pbVar7 | bVar5;
    if (((uint)multiplier < 9) && ((0x117U >> (multiplier & 0x1fU) & 1) != 0)) {
      if (index == rNONE && (base & ~rESI) != rESP) {
        piVar1 = (int *)(stream + 1);
      }
      else {
        uVar3 = 5;
        if (index != rNONE) {
          uVar3 = (ulong)index;
        }
        piVar1 = (int *)(stream + 2);
        stream[1] = bVar6 | (&DAT_001fa518)[(uint)multiplier] | regCode[uVar3] << 3;
      }
      if (bVar10 || bVar9) {
        *piVar1 = displacement;
        uVar2 = 4;
      }
      else {
        *(uchar *)piVar1 = (uchar)displacement;
        uVar2 = (uint)(bVar5 != 0);
      }
      return ((int)piVar1 + uVar2) - (int)stream;
    }
    __assertion = 
    "multiplier == 0 || multiplier == 1 || multiplier == 2 || multiplier == 4 || multiplier == 8";
    uVar2 = 0x6e;
  }
  else {
    __assertion = "spareField < 16";
    uVar2 = 0x3c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                ,uVar2,
                "unsigned int encodeAddress(unsigned char *, x86Reg, int, x86Reg, int, unsigned int)"
               );
}

Assistant:

unsigned int	encodeAddress(unsigned char* stream, x86Reg index, int multiplier, x86Reg base, int displacement, unsigned spareField)
{
	assert(index != rESP);
	assert(spareField < 16);

	unsigned char* start = stream;

	bool dispImm8 = (char)(displacement) == displacement && base != rNONE;

	unsigned char mod = 0;
	if(displacement)
	{
		if(dispImm8)
			mod = 1 << 6;
		else
			mod = 2 << 6;
	}

	// special case: [ebp] should be encoded as [ebp+0]
	if(displacement == 0 && base == rEBP)
		mod = 1 << 6;

	// special case: [r13] should be encoded as [r13+0]
	if(displacement == 0 && base == rR13)
		mod = 1 << 6;

	if(index == rNONE && base == rNONE)
		mod = 0;

	unsigned char spare = (unsigned char)(spareField & 0x7) << 3;

	unsigned char RM = regCode[rEBP]; // by default, it's simply [displacement]
	if(base != rNONE)
		RM = regCode[base];	// this is [base + displacement]
	if(index != rNONE)
		RM = regCode[rESP];	// this changes mode to [index*multiplier + base + displacement]

	unsigned char sibBase = regCode[base];

	if(index != rNONE && base == rNONE)
	{
		mod = 0;
		sibBase = regCode[rEBP];
	}

	*stream++ = mod | spare | RM;
	unsigned char sibScale = 0;
	if(multiplier == 2)
		sibScale = 1 << 6;
	else if(multiplier == 4)
		sibScale = 2 << 6;
	else if(multiplier == 8)
		sibScale = 3 << 6;
	assert(multiplier == 0 || multiplier == 1 || multiplier == 2 || multiplier == 4 || multiplier == 8);

	unsigned char sibIndex = (index != rNONE ? regCode[index] << 3 : regCode[rESP] << 3);
	
	if(index != rNONE || base == rESP || base == rR12)
		*stream++ = sibScale | sibIndex | sibBase;
	
	if(dispImm8)
	{
		*stream = (char)displacement;
		if(mod)
			stream++;
	}
	else
	{
		memcpy(stream, &displacement, sizeof(displacement));
		stream += sizeof(displacement);
	}
	return (int)(stream - start);
}